

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

void clear_closed_event(socket_server *ss,socket_message *result,int type)

{
  void *pvVar1;
  socket *s;
  event *e;
  int i;
  int id;
  int type_local;
  socket_message *result_local;
  socket_server *ss_local;
  
  if ((type == 1) || (type == 4)) {
    for (e._4_4_ = ss->event_index; e._4_4_ < ss->event_n; e._4_4_ = e._4_4_ + 1) {
      pvVar1 = ss->ev[e._4_4_].s;
      if (((pvVar1 != (void *)0x0) && (*(short *)((long)pvVar1 + 0x3a) == 0)) &&
         (*(int *)((long)pvVar1 + 0x34) == result->id)) {
        ss->ev[e._4_4_].s = (void *)0x0;
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void 
clear_closed_event(struct socket_server *ss, struct socket_message * result, int type) {
	if (type == SOCKET_CLOSE || type == SOCKET_ERROR) {
		int id = result->id;
		int i;
		for (i=ss->event_index; i<ss->event_n; i++) {
			struct event *e = &ss->ev[i];
			struct socket *s = e->s;
			if (s) {
				if (s->type == SOCKET_TYPE_INVALID && s->id == id) {
					e->s = NULL;
					break;
				}
			}
		}
	}
}